

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O2

void __thiscall roaring::Roaring64Map::flipClosed(Roaring64Map *this,uint32_t min,uint32_t max)

{
  const_iterator __pos;
  tuple<> local_2d;
  int local_2c;
  _Head_base<0UL,_int_&&,_false> local_28;
  
  __pos._M_node = (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (((_Rb_tree_header *)__pos._M_node == &(this->roarings)._M_t._M_impl.super__Rb_tree_header) ||
     (__pos._M_node[1]._M_color != _S_red)) {
    local_28._M_head_impl = &local_2c;
    local_2c = 0;
    __pos._M_node =
         (_Base_ptr)
         std::
         _Rb_tree<unsigned_int,std::pair<unsigned_int_const,roaring::Roaring>,std::_Select1st<std::pair<unsigned_int_const,roaring::Roaring>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,roaring::Roaring>>>
         ::_M_emplace_hint_unique<std::piecewise_construct_t_const&,std::tuple<int&&>,std::tuple<>>
                   ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,roaring::Roaring>,std::_Select1st<std::pair<unsigned_int_const,roaring::Roaring>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,roaring::Roaring>>>
                     *)this,__pos,(piecewise_construct_t *)&std::piecewise_construct,
                    (tuple<int_&&> *)&local_28,&local_2d);
    *(byte *)&__pos._M_node[2]._M_parent =
         *(byte *)&__pos._M_node[2]._M_parent & 0xfe | this->copyOnWrite;
  }
  Roaring::flipClosed((Roaring *)&__pos._M_node[1]._M_parent,min,max);
  eraseIfEmpty(this,(iterator)__pos._M_node);
  return;
}

Assistant:

void flipClosed(uint32_t min, uint32_t max) {
        auto iter = roarings.begin();
        // Since min and max are uint32_t, highbytes(min or max) == 0. The inner
        // bitmap we are looking for, if it exists, will be at the first slot of
        // 'roarings'. If it does not exist, we have to create it.
        if (iter == roarings.end() || iter->first != 0) {
            iter = roarings.emplace_hint(iter, std::piecewise_construct,
                                         std::forward_as_tuple(0),
                                         std::forward_as_tuple());
            auto &bitmap = iter->second;
            bitmap.setCopyOnWrite(copyOnWrite);
        }
        auto &bitmap = iter->second;
        bitmap.flipClosed(min, max);
        eraseIfEmpty(iter);
    }